

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVRFile.cpp
# Opt level: O0

void __thiscall BVRFile::BVRFile(BVRFile *this,vector<char,_std::allocator<char>_> *buf)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __first;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  void *pvVar5;
  reference ppcVar6;
  char *__s2;
  char *__s1;
  reference pvVar7;
  size_type sVar8;
  vector<char,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  double dVar9;
  char *loc_1;
  double posy_1;
  double posx_1;
  BRDNail nail;
  double posy;
  double posx;
  char *loc;
  BRDPin pin;
  BRDPart part;
  double y;
  double x;
  BRDPoint point;
  char *s;
  char *p;
  char *line;
  iterator line_it;
  vector<char_*,_std::allocator<char_*>_> lines;
  int current_block;
  char *arena_end;
  char *arena;
  size_t file_buf_size;
  char ppn [100];
  char *saved_locale;
  size_type buffer_size;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffa18;
  BRDPin *in_stack_fffffffffffffa20;
  value_type *in_stack_fffffffffffffa28;
  BRDPart *in_stack_fffffffffffffa30;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffa38;
  byte **ppbVar10;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  BRDFileBase *in_stack_fffffffffffffa70;
  BRDPoint local_360 [2];
  byte *local_350;
  byte *local_348;
  char **local_340;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_338 [4];
  int local_314;
  undefined1 *local_310;
  long local_308;
  char *local_300;
  char *local_2f8;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  size_t local_1c8;
  string local_1c0 [55];
  allocator<char> local_189;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  char local_88 [104];
  char *local_20;
  size_type local_18;
  vector<char,_std::allocator<char>_> *local_10;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffa68 >> 0x20);
  local_10 = in_RSI;
  BRDFileBase::BRDFileBase(in_stack_fffffffffffffa70);
  *in_RDI = &PTR__BVRFile_00302f30;
  local_18 = std::vector<char,_std::allocator<char>_>::size(local_10);
  memset(local_88,0,100);
  local_20 = setlocale(1,"C");
  if (local_18 < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58,
               (allocator<char> *)in_stack_fffffffffffffa50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
    std::__cxx11::to_string(iVar2);
    std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
    uVar4 = std::__cxx11::string::c_str();
    SDL_LogError(1,"%s",uVar4);
  }
  else {
    local_1c8 = (local_18 + 1) * 3;
    pvVar5 = calloc(1,local_1c8);
    in_RDI[0x17] = pvVar5;
    if (in_RDI[0x17] == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58,
                 (allocator<char> *)in_stack_fffffffffffffa50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
      std::__cxx11::to_string(iVar2);
      std::operator+(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_1e8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_2f0);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
      uVar4 = std::__cxx11::string::c_str();
      SDL_LogError(1,"%s",uVar4);
    }
    else {
      local_2f8 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffa18)
      ;
      local_300 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffa18);
      __first._M_current._4_4_ = in_stack_fffffffffffffa44;
      __first._M_current._0_4_ = in_stack_fffffffffffffa40;
      std::copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*>
                (__first,in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30);
      *(undefined1 *)(in_RDI[0x17] + local_18) = 0;
      local_308 = local_18 + 1 + in_RDI[0x17];
      local_310 = (undefined1 *)(in_RDI[0x17] + -1 + local_1c8);
      *local_310 = 0;
      local_314 = 0;
      std::vector<char_*,_std::allocator<char_*>_>::vector
                ((vector<char_*,_std::allocator<char_*>_> *)0x173e2c);
      stringfile((char *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffa38._M_current);
      local_338[0]._M_current =
           (char **)std::vector<char_*,_std::allocator<char_*>_>::begin
                              ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffa18)
      ;
      while( true ) {
        local_340 = (char **)std::vector<char_*,_std::allocator<char_*>_>::end
                                       ((vector<char_*,_std::allocator<char_*>_> *)
                                        in_stack_fffffffffffffa18);
        bVar1 = __gnu_cxx::operator<
                          ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                            *)in_stack_fffffffffffffa20,
                           (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                            *)in_stack_fffffffffffffa18);
        if (!bVar1) break;
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
                  operator*(local_338);
        local_348 = (byte *)*ppcVar6;
        __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
        operator++(local_338);
        while (iVar2 = isspace((uint)*local_348), iVar2 != 0) {
          local_348 = local_348 + 1;
        }
        if (*local_348 != 0) {
          iVar2 = strcmp((char *)local_348,"<<Layout>>");
          if (iVar2 == 0) {
            local_314 = 1;
            __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
            operator+=(local_338,1);
          }
          else {
            iVar2 = strcmp((char *)local_348,"<<Pin>>");
            if (iVar2 == 0) {
              local_314 = 2;
              __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator+=(local_338,1);
            }
            else {
              iVar2 = strcmp((char *)local_348,"<<Nail>>");
              if (iVar2 == 0) {
                local_314 = 3;
                __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                ::operator+=(local_338,1);
              }
              else {
                local_350 = local_348;
                if (local_314 == 1) {
                  BRDPoint::BRDPoint(local_360);
                  dVar9 = strtod((char *)local_350,(char **)&local_350);
                  dVar9 = trunc(dVar9 * 1000.0);
                  local_360[0].x = (int)dVar9;
                  if (*local_350 == 0x2c) {
                    local_350 = local_350 + 1;
                  }
                  dVar9 = strtod((char *)local_350,(char **)&local_350);
                  dVar9 = trunc(dVar9 * 1000.0);
                  local_360[0].y = (int)dVar9;
                  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                            ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                             in_stack_fffffffffffffa30,(value_type *)in_stack_fffffffffffffa28);
                }
                else if (local_314 == 2) {
                  BRDPart::BRDPart(in_stack_fffffffffffffa30);
                  BRDPin::BRDPin(in_stack_fffffffffffffa20);
                  __s2 = BVRFile::anon_class_32_4_fa413470::operator()
                                   ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffa20);
                  __s1 = BVRFile::anon_class_32_4_fa413470::operator()
                                   ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffa20);
                  strcmp(__s1,"(T)");
                  iVar2 = strcmp(local_88,__s2);
                  if (iVar2 != 0) {
                    std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                              ((vector<BRDPart,_std::allocator<BRDPart>_> *)
                               in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
                    snprintf(local_88,100,"%s",__s2);
                  }
                  std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                            ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9));
                  strtol((char *)local_350,(char **)&local_350,10);
                  BVRFile::anon_class_32_4_fa413470::operator()
                            ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffa20);
                  ppbVar10 = &local_350;
                  dVar9 = strtod((char *)local_350,(char **)ppbVar10);
                  trunc(dVar9 * 1000.0);
                  dVar9 = strtod((char *)local_350,(char **)ppbVar10);
                  trunc(dVar9 * 1000.0);
                  strtol((char *)local_350,(char **)ppbVar10,10);
                  BVRFile::anon_class_32_4_fa413470::operator()
                            ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffa20);
                  std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                            ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffffa30,
                             (value_type *)in_stack_fffffffffffffa28);
                  sVar8 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                                    ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc));
                  uVar3 = (uint)sVar8;
                  pvVar7 = std::vector<BRDPart,_std::allocator<BRDPart>_>::back
                                     ((vector<BRDPart,_std::allocator<BRDPart>_> *)
                                      in_stack_fffffffffffffa20);
                  pvVar7->end_of_pins = uVar3;
                  BRDPart::~BRDPart((BRDPart *)0x1744ab);
                }
                else if (local_314 == 3) {
                  BRDNail::BRDNail((BRDNail *)in_stack_fffffffffffffa20);
                  local_350 = (byte *)nextfield((char *)local_350);
                  ppbVar10 = &local_350;
                  dVar9 = strtod((char *)local_350,(char **)ppbVar10);
                  in_stack_fffffffffffffa30 = (BRDPart *)0x408f400000000000;
                  trunc(dVar9 * 1000.0);
                  dVar9 = strtod((char *)local_350,(char **)ppbVar10);
                  trunc(dVar9 * (double)in_stack_fffffffffffffa30);
                  strtol((char *)local_350,(char **)ppbVar10,10);
                  BVRFile::anon_class_32_4_fa413470::operator()
                            ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffa20);
                  in_stack_fffffffffffffa28 =
                       (value_type *)
                       BVRFile::anon_class_32_4_fa413470::operator()
                                 ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffa20);
                  strcmp((char *)in_stack_fffffffffffffa28,"(T)");
                  BVRFile::anon_class_32_4_fa413470::operator()
                            ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffa20);
                  in_stack_fffffffffffffa20 =
                       (BRDPin *)
                       BVRFile::anon_class_32_4_fa413470::operator()
                                 ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffa20);
                  std::vector<BRDNail,_std::allocator<BRDNail>_>::push_back
                            ((vector<BRDNail,_std::allocator<BRDNail>_> *)in_stack_fffffffffffffa30,
                             (value_type *)in_stack_fffffffffffffa28);
                }
              }
            }
          }
        }
      }
      sVar8 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                        ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9));
      *(int *)((long)in_RDI + 0xc) = (int)sVar8;
      sVar8 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                        ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc));
      *(int *)(in_RDI + 2) = (int)sVar8;
      sVar8 = std::vector<BRDPoint,_std::allocator<BRDPoint>_>::size
                        ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)(in_RDI + 3));
      *(int *)(in_RDI + 1) = (int)sVar8;
      sVar8 = std::vector<BRDNail,_std::allocator<BRDNail>_>::size
                        ((vector<BRDNail,_std::allocator<BRDNail>_> *)(in_RDI + 0xf));
      *(int *)((long)in_RDI + 0x14) = (int)sVar8;
      setlocale(1,local_20);
      *(bool *)(in_RDI + 0x12) = local_314 != 0;
      std::vector<char_*,_std::allocator<char_*>_>::~vector
                ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffa30);
    }
  }
  return;
}

Assistant:

BVRFile::BVRFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();

	char *saved_locale;
	char ppn[100] = {0};                        // previous part name
	saved_locale  = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	int current_block = 0;

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	std::vector<char *>::iterator line_it = lines.begin();
	while (line_it < lines.end()) {
		char *line = *line_it;
		++line_it;

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		if (!strcmp(line, "<<Layout>>")) {
			//			fprintf(stderr,"HIT LAYOUT\n");
			current_block = 1;
			line_it += 1; // Skip 1 unused lines before 1st layout
			continue;
		}
		if (!strcmp(line, "<<Pin>>")) {
			current_block = 2;
			//			fprintf(stderr,"HIT PIN, block = %d\n", current_block);
			line_it += 1; // Skip 1 unused lines before 1st pin
			continue;
		}
		if (!strcmp(line, "<<Nail>>")) {
			//			fprintf(stderr,"HIT NAIL\n");
			current_block = 3;
			line_it += 1; // Skip 1 unused lines before 1st nail
			continue;
		}

		char *p = line;
		char *s;

		switch (current_block) {
			case 1: { // Format
				BRDPoint point;
				double x = READ_DOUBLE();
				point.x  = trunc(x * 1000); // OBV uses integers
				if (*p == ',') p++;
				double y = READ_DOUBLE();
				point.y  = trunc(y * 1000);
				format.push_back(point);
			} break;

			case 2: { // Parts & Pins
				BRDPart part;
				BRDPin pin;

				part.name      = READ_STR();
				part.part_type = BRDPartType::SMD;
				char *loc      = READ_STR();
				if (!strcmp(loc, "(T)"))
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom

				// If this is the first time we've seen this part
				if ((strcmp(ppn, part.name))) {
					part.end_of_pins = 0;
					parts.push_back(part);
					snprintf(ppn, sizeof(ppn), "%s", part.name);
				}

				pin.part = parts.size(); // the part this pin is associated with, is the last part on the vector

				/*int id =*/READ_INT(); // uint
				pin.name = READ_STR();
				double posx = READ_DOUBLE();
				pin.pos.x   = trunc(posx * 1000);
				double posy = READ_DOUBLE();
				pin.pos.y   = trunc(posy * 1000);
				/*int layer =*/READ_INT(); // uint
				pin.net = READ_STR();
				// pin.probe = READ_INT();
				switch (part.mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				//
				pins.push_back(pin);
				parts.back().end_of_pins = pins.size();
			} break;

			case 3: { // Nails
				BRDNail nail;

				p           = nextfield(p);
				double posx = READ_DOUBLE();
				nail.pos.x  = trunc(posx * 1000);
				double posy = READ_DOUBLE();
				nail.pos.y  = trunc(posy * 1000);
				/*int type =*/READ_INT(); // uint
				/*char *grid =*/READ_STR();
				char *loc = READ_STR();
				if (!strcmp(loc, "(T)"))
					nail.side = BRDPartMountingSide::Top;
				else
					nail.side = BRDPartMountingSide::Bottom;

				/*char *netid =*/READ_STR();
				nail.net   = READ_STR();
				nail.pos.x = posx * 1000;
				nail.pos.y = posy * 1000;
				nails.push_back(nail);
				// nail.probe = READ_INT();
				//
			} break;

			default: continue;
		}
	}

	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != 0;
}